

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void CServer::ConKick(IResult *pResult,void *pUser)

{
  int iVar1;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  char aBuf [128];
  char acStack_a8 [136];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)pResult->m_NumArgs < 2) {
    iVar1 = (*pResult->_vptr_IResult[2])(pResult,0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      (**(code **)(*pUser + 0xa8))(pUser,iVar1,"Kicked by console",*(code **)(*pUser + 0xa8));
      return;
    }
  }
  else {
    iVar1 = (*pResult->_vptr_IResult[4])(pResult,1);
    str_format(acStack_a8,0x80,"Kicked (%s)",CONCAT44(extraout_var,iVar1));
    iVar1 = (*pResult->_vptr_IResult[2])(pResult,0);
    (**(code **)(*pUser + 0xa8))(pUser,iVar1,acStack_a8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void CServer::ConKick(IConsole::IResult *pResult, void *pUser)
{
	if(pResult->NumArguments() > 1)
	{
		char aBuf[128];
		str_format(aBuf, sizeof(aBuf), "Kicked (%s)", pResult->GetString(1));
		((CServer *)pUser)->Kick(pResult->GetInteger(0), aBuf);
	}
	else
		((CServer *)pUser)->Kick(pResult->GetInteger(0), "Kicked by console");
}